

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O0

int __thiscall CConsoleNetConnection::Recv(CConsoleNetConnection *this,char *pLine,int MaxLength)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  CConsoleNetConnection *in_RDI;
  int EndOffset;
  int StartOffset;
  uint6 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  undefined1 uVar3;
  int local_24;
  int local_20;
  
  iVar1 = State(in_RDI);
  if ((iVar1 != 4) || (in_RDI->m_BufferOffset == 0)) {
    return 0;
  }
  local_20 = 0;
  do {
    uVar3 = true;
    if (in_RDI->m_aBuffer[local_20] != '\r') {
      uVar3 = in_RDI->m_aBuffer[local_20] == '\n';
    }
    if ((bool)uVar3 == false) {
      local_24 = local_20;
      while( true ) {
        uVar2 = false;
        if (in_RDI->m_aBuffer[local_24] != '\r') {
          uVar2 = in_RDI->m_aBuffer[local_24] != '\n';
        }
        if ((bool)uVar2 == false) break;
        local_24 = local_24 + 1;
        if (in_RDI->m_BufferOffset <= local_24) {
          if (0 < local_20) {
            mem_move(in_RDI,(void *)(ulong)CONCAT16(uVar2,in_stack_ffffffffffffffc8),0);
            in_RDI->m_BufferOffset = in_RDI->m_BufferOffset - local_20;
          }
          return 0;
        }
      }
      if (in_EDX + -1 < local_24 - local_20) {
        if (0 < local_20) {
          mem_move(in_RDI,(void *)(ulong)in_stack_ffffffffffffffc8,0);
          in_RDI->m_BufferOffset = in_RDI->m_BufferOffset - local_20;
        }
        return 0;
      }
      mem_copy(in_RDI,(void *)(ulong)in_stack_ffffffffffffffc8,0);
      in_RSI[local_24 - local_20] = '\0';
      str_sanitize_cc(in_RSI);
      mem_move(in_RDI,(void *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffc8)),0);
      in_RDI->m_BufferOffset = in_RDI->m_BufferOffset - local_24;
      return 1;
    }
    if ((in_RDI->m_LineEndingDetected & 1U) == 0) {
      in_RDI->m_aLineEnding[0] = in_RDI->m_aBuffer[local_20];
      if ((local_20 + 1 < in_RDI->m_BufferOffset) &&
         (((in_RDI->m_aBuffer[local_20 + 1] == '\r' || (in_RDI->m_aBuffer[local_20 + 1] == '\n')) &&
          (in_RDI->m_aBuffer[local_20] != in_RDI->m_aBuffer[local_20 + 1])))) {
        in_RDI->m_aLineEnding[1] = in_RDI->m_aBuffer[local_20 + 1];
      }
      in_RDI->m_LineEndingDetected = true;
    }
    local_20 = local_20 + 1;
  } while (local_20 < in_RDI->m_BufferOffset);
  in_RDI->m_BufferOffset = 0;
  return 0;
}

Assistant:

int CConsoleNetConnection::Recv(char *pLine, int MaxLength)
{
	if(State() == NET_CONNSTATE_ONLINE)
	{
		if(m_BufferOffset)
		{
			// find message start
			int StartOffset = 0;
			while(m_aBuffer[StartOffset] == '\r' || m_aBuffer[StartOffset] == '\n')
			{
				// detect clients line ending format
				if(!m_LineEndingDetected)
				{
					m_aLineEnding[0] = m_aBuffer[StartOffset];
					if(StartOffset+1 < m_BufferOffset && (m_aBuffer[StartOffset+1] == '\r' || m_aBuffer[StartOffset+1] == '\n') &&
						m_aBuffer[StartOffset] != m_aBuffer[StartOffset+1])
						m_aLineEnding[1] = m_aBuffer[StartOffset+1];
					m_LineEndingDetected = true;
				}

				if(++StartOffset >= m_BufferOffset)
				{
					m_BufferOffset = 0;
					return 0;
				}
			}

			// find message end
			int EndOffset = StartOffset;
			while(m_aBuffer[EndOffset] != '\r' && m_aBuffer[EndOffset] != '\n')
			{
				if(++EndOffset >= m_BufferOffset)
				{
					if(StartOffset > 0)
					{
						mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
						m_BufferOffset -= StartOffset;
					}
					return 0;
				}
			}

			// extract message and update buffer
			if(MaxLength-1 < EndOffset-StartOffset)
			{
				if(StartOffset > 0)
				{
					mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
					m_BufferOffset -= StartOffset;
				}
				return 0;
			}
			mem_copy(pLine, m_aBuffer+StartOffset, EndOffset-StartOffset);
			pLine[EndOffset-StartOffset] = 0;
			str_sanitize_cc(pLine);
			mem_move(m_aBuffer, m_aBuffer+EndOffset, m_BufferOffset-EndOffset);
			m_BufferOffset -= EndOffset;
			return 1;
		}
	}
	return 0;
}